

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O0

size_type llvm::StrInStrNoCase(StringRef s1,StringRef s2)

{
  StringRef RHS;
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  StringRef local_b8;
  char *local_a8;
  size_t e;
  size_t i;
  size_t M;
  size_t N;
  StringRef s2_local;
  StringRef s1_local;
  unsigned_long local_50;
  size_t local_48;
  size_t local_40;
  size_t *local_38;
  undefined1 local_30 [16];
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  M = s2.Length;
  N = (size_t)s2.Data;
  i = s1.Length;
  s2_local.Length = (size_t)s1.Data;
  if (M <= i) {
    local_a8 = (char *)(i + (1 - M));
    s2_local.Data = (char *)M;
    s1_local.Data = (char *)i;
    for (e = 0; (char *)e != local_a8; e = e + 1) {
      local_38 = &s2_local.Length;
      local_40 = e;
      local_48 = M;
      puVar2 = std::min<unsigned_long>(&local_40,(unsigned_long *)&s1_local);
      local_40 = *puVar2;
      pcVar3 = (char *)(s2_local.Length + local_40);
      local_50 = (long)s1_local.Data - local_40;
      puVar2 = std::min<unsigned_long>(&local_48,&local_50);
      local_b8.Length = *puVar2;
      local_10 = local_30;
      RHS.Length = (size_t)s2_local.Data;
      RHS.Data = (char *)N;
      local_b8.Data = pcVar3;
      local_20 = local_b8.Length;
      local_18 = pcVar3;
      bVar1 = StringRef::equals_lower(&local_b8,RHS);
      if (bVar1) {
        return e;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

StringRef::size_type llvm::StrInStrNoCase(StringRef s1, StringRef s2) {
  size_t N = s2.size(), M = s1.size();
  if (N > M)
    return StringRef::npos;
  for (size_t i = 0, e = M - N + 1; i != e; ++i)
    if (s1.substr(i, N).equals_lower(s2))
      return i;
  return StringRef::npos;
}